

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_v3.cc
# Opt level: O3

int X509_EXTENSION_set_critical(X509_EXTENSION *ex,int crit)

{
  if (ex != (X509_EXTENSION *)0x0) {
    ex->critical = -(uint)(crit == 0) | 0xff;
  }
  return (uint)(ex != (X509_EXTENSION *)0x0);
}

Assistant:

int X509_EXTENSION_set_critical(X509_EXTENSION *ex, int crit) {
  if (ex == NULL) {
    return 0;
  }
  // The critical field is DEFAULT FALSE, so non-critical extensions should omit
  // the value.
  ex->critical = crit ? ASN1_BOOLEAN_TRUE : ASN1_BOOLEAN_NONE;
  return 1;
}